

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

void APhyBullet::printError(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buffer [2048];
  undefined8 local_8d8;
  void **local_8d0;
  undefined1 *local_8c8;
  undefined1 local_8b8 [8];
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_890;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  undefined8 local_818;
  char local_808 [2048];
  
  local_8c8 = local_8b8;
  if (in_AL != '\0') {
    local_888 = in_XMM0_Qa;
    local_878 = in_XMM1_Qa;
    local_868 = in_XMM2_Qa;
    local_858 = in_XMM3_Qa;
    local_848 = in_XMM4_Qa;
    local_838 = in_XMM5_Qa;
    local_828 = in_XMM6_Qa;
    local_818 = in_XMM7_Qa;
  }
  local_8d0 = &args[0].overflow_arg_area;
  local_8d8 = 0x3000000008;
  local_8b0 = in_RSI;
  local_8a8 = in_RDX;
  local_8a0 = in_RCX;
  local_898 = in_R8;
  local_890 = in_R9;
  vsnprintf(local_808,0x800,format,&local_8d8);
  fputs(local_808,_stderr);
  return;
}

Assistant:

void printError(const char *format, ...)
{
    char buffer[2048];
    va_list args;
    va_start(args, format);
    vsnprintf(buffer, 2048, format, args);
#ifdef _WIN32
    if(!GetConsoleCP())
        OutputDebugStringA(buffer);
    else
        fputs(buffer, stderr);
#else
    fputs(buffer, stderr);
#endif
    va_end(args);
}